

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdep.c
# Opt level: O2

int qemu_mprotect__osdep(void *addr,size_t size,int prot)

{
  int iVar1;
  
  iVar1 = mprotect(addr,size,prot);
  return -(uint)(iVar1 != 0);
}

Assistant:

static int qemu_mprotect__osdep(void *addr, size_t size, int prot)
{
#ifdef _WIN32
    DWORD old_protect;

    if (!VirtualProtect(addr, size, prot, &old_protect)) {
        // g_autofree gchar *emsg = g_win32_error_message(GetLastError());
        // error_report("%s: VirtualProtect failed: %s", __func__, emsg);
        return -1;
    }
    return 0;
#else
    if (mprotect(addr, size, prot)) {
        // error_report("%s: mprotect failed: %s", __func__, strerror(errno));
        return -1;
    }
    return 0;
#endif
}